

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertPreviewSurfaceShader
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *shader_abs_path,
          UsdPreviewSurface *shader,PreviewSurfaceShader *rshader_out)

{
  bool bVar1;
  ostream *poVar2;
  Animatable<int> *this_00;
  allocator local_a11;
  string local_a10;
  allocator local_9e9;
  string local_9e8;
  allocator local_9c1;
  string local_9c0;
  allocator local_999;
  string local_998;
  allocator local_971;
  string local_970;
  allocator local_949;
  string local_948;
  allocator local_921;
  string local_920;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  allocator local_881;
  string local_880;
  allocator local_859;
  string local_858;
  allocator local_831;
  string local_830;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  string local_7c8;
  ostringstream local_7a8 [8];
  ostringstream ss_e_3;
  int local_62c;
  undefined1 local_628 [4];
  int val;
  allocator local_601;
  string local_600;
  string local_5e0;
  ostringstream local_5c0 [8];
  ostringstream ss_e_2;
  string local_448;
  allocator local_421;
  string local_420;
  string local_400;
  ostringstream local_3e0 [8];
  ostringstream ss_e_1;
  undefined1 local_268 [8];
  PreviewSurfaceShader rshader;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  PreviewSurfaceShader *rshader_out_local;
  UsdPreviewSurface *shader_local;
  Path *shader_abs_path_local;
  RenderSceneConverterEnv *env_local;
  RenderSceneConverter *this_local;
  
  if (rshader_out == (PreviewSurfaceShader *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ConvertPreviewSurfaceShader");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1323);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"rshader_out arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&rshader.handle);
    ::std::__cxx11::string::~string((string *)&rshader.handle);
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
    return false;
  }
  PreviewSurfaceShader::PreviewSurfaceShader((PreviewSurfaceShader *)local_268);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::authored
                    (&shader->useSpecularWorkflow);
  if (bVar1) {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::is_blocked
                      (&shader->useSpecularWorkflow);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_3e0);
      poVar2 = ::std::operator<<((ostream *)local_3e0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ConvertPreviewSurfaceShader");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x132b);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_420,"useSpecularWorkflow attribute is blocked.",&local_421);
      fmt::format(&local_400,&local_420);
      poVar2 = ::std::operator<<((ostream *)local_3e0,(string *)&local_400);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_400);
      ::std::__cxx11::string::~string((string *)&local_420);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_448);
      ::std::__cxx11::string::~string((string *)&local_448);
      ::std::__cxx11::ostringstream::~ostringstream(local_3e0);
      return false;
    }
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::is_connection
                      (&shader->useSpecularWorkflow);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_5c0);
      poVar2 = ::std::operator<<((ostream *)local_5c0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ConvertPreviewSurfaceShader");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x132e);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_600,"TODO: useSpecularWorkflow with connection.",&local_601);
      fmt::format(&local_5e0,&local_600);
      poVar2 = ::std::operator<<((ostream *)local_5c0,(string *)&local_5e0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_5e0);
      ::std::__cxx11::string::~string((string *)&local_600);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_601);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_628);
      ::std::__cxx11::string::~string((string *)local_628);
      ::std::__cxx11::ostringstream::~ostringstream(local_5c0);
      return false;
    }
    this_00 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::get_value
                        (&shader->useSpecularWorkflow);
    bVar1 = Animatable<int>::get(this_00,env->timecode,&local_62c,Linear);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7a8);
      poVar2 = ::std::operator<<((ostream *)local_7a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ConvertPreviewSurfaceShader");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1334);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_7e8,"Failed to get useSpcularWorkflow value at time `{}`.",
                 &local_7e9);
      fmt::format<double>(&local_7c8,&local_7e8,&env->timecode);
      poVar2 = ::std::operator<<((ostream *)local_7a8,(string *)&local_7c8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_7c8);
      ::std::__cxx11::string::~string((string *)&local_7e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_810);
      ::std::__cxx11::string::~string((string *)&local_810);
      ::std::__cxx11::ostringstream::~ostringstream(local_7a8);
      return false;
    }
    local_268[0] = (bool)(-(local_62c != 0) & 1);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_830,"diffuseColor",&local_831);
  bVar1 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                    (this,env,shader_abs_path,&shader->diffuseColor,&local_830,
                     (ShaderParam<std::array<float,_3UL>_> *)(local_268 + 4));
  ::std::__cxx11::string::~string((string *)&local_830);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_858,"emissiveColor",&local_859);
    bVar1 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                      (this,env,shader_abs_path,&shader->emissiveColor,&local_858,
                       (ShaderParam<std::array<float,_3UL>_> *)
                       (rshader.diffuseColor.value._M_elems + 2));
    ::std::__cxx11::string::~string((string *)&local_858);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_880,"specularColor",&local_881);
      bVar1 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->specularColor,&local_880,
                         (ShaderParam<std::array<float,_3UL>_> *)
                         (rshader.emissiveColor.value._M_elems + 2));
      ::std::__cxx11::string::~string((string *)&local_880);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_881);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_8a8,"normal",&local_8a9);
        bVar1 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::normal3f,std::array<float,3ul>>
                          (this,env,shader_abs_path,&shader->normal,&local_8a8,
                           (ShaderParam<std::array<float,_3UL>_> *)&rshader.ior);
        ::std::__cxx11::string::~string((string *)&local_8a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_8d0,"roughness",&local_8d1);
          bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                            (this,env,shader_abs_path,&shader->roughness,&local_8d0,
                             &rshader.metallic);
          ::std::__cxx11::string::~string((string *)&local_8d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_8f8,"metallic",&local_8f9);
            bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                              (this,env,shader_abs_path,&shader->metallic,&local_8f8,
                               (ShaderParam<float> *)(rshader.specularColor.value._M_elems + 2));
            ::std::__cxx11::string::~string((string *)&local_8f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_920,"clearcoat",&local_921);
              bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                (this,env,shader_abs_path,&shader->clearcoat,&local_920,
                                 &rshader.roughness);
              ::std::__cxx11::string::~string((string *)&local_920);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_921);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_948,"clearcoatRoughness",&local_949)
                ;
                bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                  (this,env,shader_abs_path,&shader->clearcoatRoughness,&local_948,
                                   &rshader.clearcoat);
                ::std::__cxx11::string::~string((string *)&local_948);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_949);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)&local_970,"opacity",&local_971);
                  bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                    (this,env,shader_abs_path,&shader->opacity,&local_970,
                                     &rshader.clearcoatRoughness);
                  ::std::__cxx11::string::~string((string *)&local_970);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_971);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)&local_998,"opacityThreshold",&local_999);
                    bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                      (this,env,shader_abs_path,&shader->opacityThreshold,&local_998
                                       ,&rshader.opacity);
                    ::std::__cxx11::string::~string((string *)&local_998);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_999);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string((string *)&local_9c0,"ior",&local_9c1);
                      bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                        (this,env,shader_abs_path,&shader->ior,&local_9c0,
                                         &rshader.opacityThreshold);
                      ::std::__cxx11::string::~string((string *)&local_9c0);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string((string *)&local_9e8,"occlusion",&local_9e9);
                        bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                          (this,env,shader_abs_path,&shader->occlusion,&local_9e8,
                                           &rshader.displacement);
                        ::std::__cxx11::string::~string((string *)&local_9e8);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    ((string *)&local_a10,"displacement",&local_a11);
                          bVar1 = ConvertPreviewSurfaceShaderParam<float,float>
                                            (this,env,shader_abs_path,&shader->displacement,
                                             &local_a10,
                                             (ShaderParam<float> *)
                                             (rshader.normal.value._M_elems + 2));
                          ::std::__cxx11::string::~string((string *)&local_a10);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_a11);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            memcpy(rshader_out,local_268,0x98);
                            this_local._7_1_ = true;
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RenderSceneConverter::ConvertPreviewSurfaceShader(
    const RenderSceneConverterEnv &env, const Path &shader_abs_path,
    const UsdPreviewSurface &shader, PreviewSurfaceShader *rshader_out) {
  if (!rshader_out) {
    PUSH_ERROR_AND_RETURN("rshader_out arg is nullptr.");
  }

  PreviewSurfaceShader rshader;

  if (shader.useSpecularWorkflow.authored()) {
    if (shader.useSpecularWorkflow.is_blocked()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("useSpecularWorkflow attribute is blocked."));
    } else if (shader.useSpecularWorkflow.is_connection()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("TODO: useSpecularWorkflow with connection."));
    } else {
      int val;
      if (!shader.useSpecularWorkflow.get_value().get(env.timecode, &val)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Failed to get useSpcularWorkflow value at time `{}`.",
                        env.timecode));
      }

      rshader.useSpecularWorkflow = val ? true : false;
    }
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.diffuseColor, "diffuseColor",
                                        rshader.diffuseColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.emissiveColor, "emissiveColor",
                                        rshader.emissiveColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.specularColor, "specularColor",
                                        rshader.specularColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.normal,
                                        "normal", rshader.normal)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.roughness,
                                        "roughness", rshader.roughness)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.metallic,
                                        "metallic", rshader.metallic)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.clearcoat,
                                        "clearcoat", rshader.clearcoat)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.clearcoatRoughness, "clearcoatRoughness",
          rshader.clearcoatRoughness)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.opacity,
                                        "opacity", rshader.opacity)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.opacityThreshold, "opacityThreshold",
          rshader.opacityThreshold)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.ior, "ior",
                                        rshader.ior)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.occlusion,
                                        "occlusion", rshader.occlusion)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.displacement, "displacement",
                                        rshader.displacement)) {
    return false;
  }

  (*rshader_out) = rshader;
  return true;
}